

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeCommitPhaseOne(Btree *p,char *zSuperJrnl)

{
  BtShared *pBVar1;
  int iVar2;
  BtShared *pBt;
  int rc;
  char *zSuperJrnl_local;
  Btree *p_local;
  
  pBt._4_4_ = 0;
  if (p->inTrans == '\x02') {
    pBVar1 = p->pBt;
    sqlite3BtreeEnter(p);
    if ((pBVar1->autoVacuum != '\0') && (iVar2 = autoVacuumCommit(p), iVar2 != 0)) {
      sqlite3BtreeLeave(p);
      return iVar2;
    }
    if (pBVar1->bDoTruncate != '\0') {
      sqlite3PagerTruncateImage(pBVar1->pPager,pBVar1->nPage);
    }
    pBt._4_4_ = sqlite3PagerCommitPhaseOne(pBVar1->pPager,zSuperJrnl,0);
    sqlite3BtreeLeave(p);
  }
  return pBt._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCommitPhaseOne(Btree *p, const char *zSuperJrnl){
  int rc = SQLITE_OK;
  if( p->inTrans==TRANS_WRITE ){
    BtShared *pBt = p->pBt;
    sqlite3BtreeEnter(p);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      rc = autoVacuumCommit(p);
      if( rc!=SQLITE_OK ){
        sqlite3BtreeLeave(p);
        return rc;
      }
    }
    if( pBt->bDoTruncate ){
      sqlite3PagerTruncateImage(pBt->pPager, pBt->nPage);
    }
#endif
    rc = sqlite3PagerCommitPhaseOne(pBt->pPager, zSuperJrnl, 0);
    sqlite3BtreeLeave(p);
  }
  return rc;
}